

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

uint16_t * GetCostModeI4(VP8EncIterator *it,uint8_t *modes)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint local_2c;
  uint local_28;
  int top;
  int left;
  int y;
  int x;
  int preds_w;
  uint8_t *modes_local;
  VP8EncIterator *it_local;
  
  iVar2 = it->enc_->preds_w_;
  uVar3 = it->i4_ & 3;
  iVar4 = it->i4_ >> 2;
  if (uVar3 == 0) {
    bVar1 = it->preds_[iVar4 * iVar2 + -1];
  }
  else {
    bVar1 = modes[it->i4_ + -1];
  }
  local_28 = (uint)bVar1;
  if (iVar4 == 0) {
    bVar1 = it->preds_[(int)(uVar3 - iVar2)];
  }
  else {
    bVar1 = modes[it->i4_ + -4];
  }
  local_2c = (uint)bVar1;
  return VP8FixedCostsI4[(int)local_2c][(int)local_28];
}

Assistant:

static const uint16_t* GetCostModeI4(VP8EncIterator* const it,
                                     const uint8_t modes[16]) {
  const int preds_w = it->enc_->preds_w_;
  const int x = (it->i4_ & 3), y = it->i4_ >> 2;
  const int left = (x == 0) ? it->preds_[y * preds_w - 1] : modes[it->i4_ - 1];
  const int top = (y == 0) ? it->preds_[-preds_w + x] : modes[it->i4_ - 4];
  return VP8FixedCostsI4[top][left];
}